

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_avx512::forward_int8
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  undefined8 uVar2;
  void *pvVar3;
  int *piVar4;
  undefined1 auVar5 [40];
  undefined1 auVar6 [64];
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  int iVar19;
  int iVar20;
  undefined8 *puVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  undefined8 *puVar25;
  _func_int *p_Var26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int z;
  undefined8 *puVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [64];
  Mat m;
  _func_int **local_c0;
  Mat m_1;
  ulong uVar15;
  
  uVar29 = bottom_blob->c;
  uVar9 = (ulong)uVar29;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar7 = bottom_blob->d;
  m.d = bottom_blob->d;
  m.c = bottom_blob->c;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      p_Var26 = this->_vptr_Padding_x86_avx512[-3];
      uVar29 = *(uint *)(&this->field_0xd8 + (long)p_Var26) + m.w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var26);
      bVar35 = (uVar29 & 7) == 0;
      if ((bVar35 && (*(uint *)(&this->field_0xd8 + (long)p_Var26) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var26) == 0)) {
        Mat::create(top_blob,(int)uVar29 >> 3,(m.elemsize >> 3) << bVar35 * '\x03',8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var26 = this->_vptr_Padding_x86_avx512[-3];
        uVar9 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var26);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,0,0,*(int *)(&this->field_0xd8 + (long)p_Var26) / 8,
                   *(int *)(&this->field_0xdc + (long)p_Var26) / 8,
                   uVar9 << 0x38 | uVar9 << 0x30 | uVar9 << 0x28 |
                   uVar9 << 0x20 | uVar9 << 0x18 | uVar9 << 0x10 | uVar9 << 8 | uVar9);
        return 0;
      }
      break;
    case 2:
      p_Var26 = this->_vptr_Padding_x86_avx512[-3];
      uVar29 = *(uint *)(&this->field_0xd0 + (long)p_Var26) + m.h * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var26);
      bVar35 = (uVar29 & 7) == 0;
      if ((bVar35 && (*(uint *)(&this->field_0xd0 + (long)p_Var26) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var26) == 0)) {
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var26) +
                             *(int *)(&this->field_0xdc + (long)p_Var26),(int)uVar29 >> 3,
                    (m.elemsize >> 3) << bVar35 * '\x03',8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var26 = this->_vptr_Padding_x86_avx512[-3];
        uVar9 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var26);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var26) / 8,
                   *(int *)(&this->field_0xd4 + (long)p_Var26) / 8,
                   *(int *)(&this->field_0xd8 + (long)p_Var26),
                   *(int *)(&this->field_0xdc + (long)p_Var26),
                   uVar9 << 0x38 | uVar9 << 0x30 | uVar9 << 0x28 |
                   uVar9 << 0x20 | uVar9 << 0x18 | uVar9 << 0x10 | uVar9 << 8 | uVar9);
        return 0;
      }
      break;
    case 3:
      p_Var26 = this->_vptr_Padding_x86_avx512[-3];
      uVar13 = *(uint *)(&this->field_0xe8 + (long)p_Var26) + uVar29 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var26);
      bVar35 = (uVar13 & 7) == 0;
      if (bVar35 && (*(uint *)(&this->field_0xe8 + (long)p_Var26) & 7) == 0) {
        if ((uVar13 == uVar29 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var26) == 0)) {
          uVar13 = (int)uVar13 >> 3;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var26) +
                               *(int *)(&this->field_0xdc + (long)p_Var26),
                      m.h + *(int *)(&this->field_0xd0 + (long)p_Var26) +
                      *(int *)(&this->field_0xd4 + (long)p_Var26),uVar13,
                      (m.elemsize >> 3) << bVar35 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          local_c0 = this->_vptr_Padding_x86_avx512;
          uVar9 = (long)*(int *)(&this->field_0xe8 + (long)local_c0[-3]) / -8;
          uVar15 = uVar9 & 0xffffffff;
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          for (uVar34 = 0; auVar36 = (undefined1  [64])m_1._0_64_, uVar34 != uVar13;
              uVar34 = uVar34 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            sVar1 = top_blob->cstep;
            puVar18 = (undefined8 *)(sVar1 * uVar34 * m.elemsize + (long)pvVar3);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = top_blob->d;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            p_Var26 = local_c0[-3];
            uVar8 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var26);
            uVar8 = uVar8 << 0x38 | uVar8 << 0x30 | uVar8 << 0x28 |
                    uVar8 << 0x20 | uVar8 << 0x18 | uVar8 << 0x10 | uVar8 << 8 | uVar8;
            uVar10 = (int)uVar9 + (int)uVar34;
            if ((int)uVar10 < 0 || (int)uVar29 <= (int)uVar10) {
              uVar10 = top_blob->d * (int)m.cstep;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar32 = 0; uVar10 != uVar32; uVar32 = uVar32 + 1) {
                *(ulong *)((long)pvVar3 + uVar32 * 8 + sVar1 * m.elemsize * uVar34) = uVar8;
              }
            }
            else {
              iVar7 = bottom_blob->w;
              lVar23 = (long)iVar7;
              iVar12 = bottom_blob->h;
              pvVar3 = bottom_blob->data;
              uVar32 = bottom_blob->elemsize;
              sVar1 = bottom_blob->cstep;
              puVar31 = (undefined8 *)(uVar10 * sVar1 * uVar32 + (long)pvVar3);
              m_1.refcount = (int *)0x0;
              m_1.data = puVar31;
              m_1.elemsize = uVar32;
              m_1._28_36_ = auVar36._28_36_;
              m_1.elempack = bottom_blob->elempack;
              auVar6 = (undefined1  [64])m_1._0_64_;
              m_1._40_24_ = auVar36._40_24_;
              m_1._0_32_ = auVar6._0_32_;
              m_1.allocator = bottom_blob->allocator;
              auVar5 = (undefined1  [40])m_1._0_40_;
              m_1.w = iVar7;
              m_1.h = iVar12;
              m_1.d = 1;
              m_1._60_4_ = auVar36._60_4_;
              m_1.c = bottom_blob->d;
              m_1.dims = bottom_blob->dims + -1;
              m_1._0_44_ = CONCAT440(m_1.dims,auVar5);
              m_1.cstep = (uVar32 * iVar12 * lVar23 + 0xf & 0xfffffffffffffff0) / uVar32;
              if (bottom_blob->dims == 4) {
                m_1.cstep = iVar12 * lVar23;
              }
              iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var26);
              if (iVar11 == 0) {
                m.data = puVar18;
                padding_constant_pack8_int8_sse
                          (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var26),
                           *(int *)(&this->field_0xd4 + (long)p_Var26),
                           *(int *)(&this->field_0xd8 + (long)p_Var26),
                           *(int *)(&this->field_0xdc + (long)p_Var26),uVar8);
                local_c0 = this->_vptr_Padding_x86_avx512;
                p_Var26 = local_c0[-3];
                iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var26);
              }
              if (iVar11 == 1) {
                iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var26);
                iVar27 = 0;
                iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var26);
                if (*(int *)(&this->field_0xd8 + (long)p_Var26) < 1) {
                  iVar20 = iVar27;
                }
                iVar30 = 0;
                if (0 < iVar7) {
                  iVar30 = iVar7;
                }
                iVar19 = *(int *)(&this->field_0xdc + (long)p_Var26);
                if (*(int *)(&this->field_0xdc + (long)p_Var26) < 1) {
                  iVar19 = iVar27;
                }
                iVar22 = *(int *)(&this->field_0xd0 + (long)p_Var26);
                if (*(int *)(&this->field_0xd0 + (long)p_Var26) < 1) {
                  iVar22 = 0;
                }
                lVar24 = sVar1 * uVar32 * uVar15;
                puVar21 = puVar18;
                for (; iVar28 = iVar20, iVar27 != iVar22; iVar27 = iVar27 + 1) {
                  while (iVar28 != 0) {
                    *puVar21 = *puVar31;
                    puVar21 = puVar21 + 1;
                    iVar28 = iVar28 + -1;
                  }
                  for (lVar33 = 0; iVar28 = iVar19, iVar30 != (int)lVar33; lVar33 = lVar33 + 1) {
                    *puVar21 = *(undefined8 *)((long)pvVar3 + lVar33 * 8 + lVar24);
                    puVar21 = puVar21 + 1;
                  }
                  while (iVar28 != 0) {
                    *puVar21 = *(undefined8 *)((long)pvVar3 + lVar33 * 8 + lVar24 + -8);
                    puVar21 = puVar21 + 1;
                    iVar28 = iVar28 + -1;
                  }
                }
                iVar30 = 0;
                iVar27 = 0;
                if (0 < m_1.w) {
                  iVar27 = m_1.w;
                }
                puVar25 = puVar31;
                iVar22 = 0;
                if (0 < iVar12) {
                  iVar22 = iVar12;
                }
                for (; iVar28 = iVar20, iVar30 != iVar22; iVar30 = iVar30 + 1) {
                  while (iVar28 != 0) {
                    *puVar21 = *puVar25;
                    puVar21 = puVar21 + 1;
                    iVar28 = iVar28 + -1;
                  }
                  lVar24 = 0;
                  for (lVar33 = 0; iVar27 != (int)lVar33; lVar33 = lVar33 + 1) {
                    puVar21[lVar33] = puVar25[lVar33];
                    lVar24 = lVar24 + -8;
                  }
                  puVar21 = (undefined8 *)((long)puVar21 - lVar24);
                  iVar28 = iVar19;
                  while (bVar35 = iVar28 != 0, iVar28 = iVar28 + -1, bVar35) {
                    *puVar21 = puVar25[lVar33 + -1];
                    puVar21 = puVar21 + 1;
                  }
                  puVar25 = (undefined8 *)((long)puVar25 - lVar24);
                }
                puVar25 = puVar25 + -(long)m_1.w;
                iVar30 = 0;
                if (iVar11 < 1) {
                  iVar11 = 0;
                  iVar30 = 0;
                }
                for (; iVar22 = iVar20, iVar30 != iVar11; iVar30 = iVar30 + 1) {
                  while (iVar22 != 0) {
                    *puVar21 = *puVar25;
                    puVar21 = puVar21 + 1;
                    iVar22 = iVar22 + -1;
                  }
                  for (lVar24 = 0; iVar22 = iVar19, iVar27 != (int)lVar24; lVar24 = lVar24 + 1) {
                    *puVar21 = puVar25[lVar24];
                    puVar21 = puVar21 + 1;
                  }
                  while (iVar22 != 0) {
                    *puVar21 = puVar25[lVar24 + -1];
                    puVar21 = puVar21 + 1;
                    iVar22 = iVar22 + -1;
                  }
                }
                p_Var26 = local_c0[-3];
                iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var26);
              }
              if (iVar11 == 2) {
                iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var26);
                uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var26);
                lVar24 = (long)(int)uVar10;
                uVar16 = 0;
                uVar8 = 0;
                if (0 < (int)uVar10) {
                  uVar8 = (ulong)uVar10;
                }
                iVar20 = 0;
                if (0 < iVar7) {
                  iVar20 = iVar7;
                }
                uVar17 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var26);
                if ((int)*(uint *)(&this->field_0xdc + (long)p_Var26) < 1) {
                  uVar17 = uVar16;
                }
                iVar27 = iVar11;
                if (iVar11 < 1) {
                  iVar27 = 0;
                }
                puVar31 = puVar31 + iVar11 * iVar7;
                iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var26);
                lVar33 = (long)pvVar3 +
                         sVar1 * uVar32 * uVar15 + lVar24 * 8 + (long)(iVar11 * iVar7) * 8;
                for (; (int)uVar16 != iVar27; uVar16 = (ulong)((int)uVar16 + 1)) {
                  for (lVar14 = 0; -lVar14 != uVar8; lVar14 = lVar14 + -1) {
                    *puVar18 = *(undefined8 *)(lVar33 + lVar14 * 8);
                    puVar18 = puVar18 + 1;
                  }
                  puVar21 = puVar31;
                  for (iVar11 = 0; iVar11 != iVar20; iVar11 = iVar11 + 1) {
                    uVar2 = *puVar21;
                    puVar21 = puVar21 + 1;
                    *puVar18 = uVar2;
                    puVar18 = puVar18 + 1;
                  }
                  for (lVar14 = 0; -lVar14 != uVar17; lVar14 = lVar14 + -1) {
                    *puVar18 = puVar21[lVar14 + -2];
                    puVar18 = puVar18 + 1;
                  }
                  puVar31 = puVar31 + -lVar23;
                  lVar33 = lVar33 + lVar23 * -8;
                }
                iVar27 = 0;
                iVar11 = 0;
                if (0 < iVar12) {
                  iVar11 = iVar12;
                }
                for (; iVar27 != iVar11; iVar27 = iVar27 + 1) {
                  for (lVar33 = 0; -lVar33 != uVar8; lVar33 = lVar33 + -1) {
                    *puVar18 = puVar31[lVar24 + lVar33];
                    puVar18 = puVar18 + 1;
                  }
                  for (iVar12 = 0; iVar12 != iVar20; iVar12 = iVar12 + 1) {
                    uVar2 = *puVar31;
                    puVar31 = puVar31 + 1;
                    *puVar18 = uVar2;
                    puVar18 = puVar18 + 1;
                  }
                  for (lVar33 = 0; -lVar33 != uVar17; lVar33 = lVar33 + -1) {
                    *puVar18 = puVar31[lVar33 + -2];
                    puVar18 = puVar18 + 1;
                  }
                }
                puVar21 = puVar31 + -(long)(iVar7 * 2);
                iVar12 = 0;
                if (iVar30 < 1) {
                  iVar30 = iVar12;
                }
                puVar31 = puVar31 + (lVar24 - iVar7 * 2);
                for (; iVar12 != iVar30; iVar12 = iVar12 + 1) {
                  for (lVar24 = 0; -lVar24 != uVar8; lVar24 = lVar24 + -1) {
                    *puVar18 = puVar31[lVar24];
                    puVar18 = puVar18 + 1;
                  }
                  puVar25 = puVar21;
                  for (iVar7 = 0; iVar7 != iVar20; iVar7 = iVar7 + 1) {
                    uVar2 = *puVar25;
                    puVar25 = puVar25 + 1;
                    *puVar18 = uVar2;
                    puVar18 = puVar18 + 1;
                  }
                  for (lVar24 = 0; -lVar24 != uVar17; lVar24 = lVar24 + -1) {
                    *puVar18 = puVar25[lVar24 + -2];
                    puVar18 = puVar18 + 1;
                  }
                  puVar21 = puVar21 + -lVar23;
                  puVar31 = puVar31 + -lVar23;
                }
              }
            }
            uVar15 = (ulong)((int)uVar15 + 1);
          }
          return 0;
        }
      }
      break;
    case 4:
      p_Var26 = this->_vptr_Padding_x86_avx512[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var26) == 0) {
        uVar13 = *(int *)(&this->field_0xe8 + (long)p_Var26) + iVar7 +
                 *(int *)(&this->field_0xec + (long)p_Var26);
        uVar15 = (ulong)uVar13;
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var26) +
                             *(int *)(&this->field_0xdc + (long)p_Var26),
                    m.h + *(int *)(&this->field_0xd0 + (long)p_Var26) +
                    *(int *)(&this->field_0xd4 + (long)p_Var26),uVar13,uVar29,m.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar13 < 1) {
          uVar15 = 0;
        }
        if ((int)uVar29 < 1) {
          uVar9 = 0;
        }
        for (uVar34 = 0; uVar34 != uVar9; uVar34 = uVar34 + 1) {
          uVar8 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86_avx512[-3]);
          uVar8 = uVar8 << 0x38 | uVar8 << 0x30 | uVar8 << 0x28 |
                  uVar8 << 0x20 | uVar8 << 0x18 | uVar8 << 0x10 | uVar8 << 8 | uVar8;
          for (uVar32 = 0; auVar36 = (undefined1  [64])m_1._0_64_, uVar32 != uVar15;
              uVar32 = uVar32 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            lVar23 = top_blob->cstep * uVar34;
            m.elempack = top_blob->elempack;
            m.cstep = (long)m.h * (long)m.w;
            m.data = (void *)((long)pvVar3 + uVar32 * m.elemsize * m.cstep + lVar23 * m.elemsize);
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.dims = 2;
            m.d = 1;
            m.c = 1;
            p_Var26 = this->_vptr_Padding_x86_avx512[-3];
            uVar29 = (int)uVar32 - *(int *)(&this->field_0xe8 + (long)p_Var26);
            if ((int)uVar29 < 0 || iVar7 <= (int)uVar29) {
              uVar16 = m.cstep & 0xffffffff;
              if ((int)m.cstep < 1) {
                uVar16 = 0;
              }
              for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
                *(ulong *)((long)pvVar3 +
                          uVar17 * 8 + m.elemsize * ((long)m.h * uVar32 * (long)m.w + lVar23)) =
                     uVar8;
              }
            }
            else {
              m_1.elemsize = bottom_blob->elemsize;
              m_1.cstep = (long)bottom_blob->h * (long)bottom_blob->w;
              m_1.refcount = (int *)0x0;
              m_1.data = (void *)((long)bottom_blob->data +
                                 m_1.cstep * m_1.elemsize * (ulong)uVar29 +
                                 bottom_blob->cstep * uVar34 * m_1.elemsize);
              m_1._28_36_ = auVar36._28_36_;
              m_1.elempack = bottom_blob->elempack;
              m_1.allocator = bottom_blob->allocator;
              m_1.dims = 2;
              m_1.w = bottom_blob->w;
              m_1.h = bottom_blob->h;
              m_1._60_4_ = auVar36._60_4_;
              m_1.d = 1;
              m_1.c = 1;
              padding_constant_pack8_int8_sse
                        (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var26),
                         *(int *)(&this->field_0xd4 + (long)p_Var26),
                         *(int *)(&this->field_0xd8 + (long)p_Var26),
                         *(int *)(&this->field_0xdc + (long)p_Var26),uVar8);
            }
          }
        }
        return 0;
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    auVar36 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar36 = vmovdqu64_avx512f(auVar36);
    m_1._16_48_ = auVar36._16_48_;
    m_1.data = auVar36._0_8_;
    m_1.refcount = (int *)opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar7 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86_avx512 +
                           (long)this->_vptr_Padding_x86_avx512[-3]),&m,top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int Padding_x86_avx512::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}